

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

string * __thiscall ObjectFile::getFilename_abi_cxx11_(ObjectFile *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long in_RSI;
  string *in_RDI;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)(in_RSI + 8),0x1f113c);
  if (lVar1 != -1) {
    uVar2 = std::__cxx11::string::find_last_of((char *)(in_RSI + 8),0x1f113c);
    uVar3 = std::__cxx11::string::size();
    if (uVar2 < uVar3) {
      std::__cxx11::string::find_last_of((char *)(in_RSI + 8),0x1f113c);
      std::__cxx11::string::substr((ulong)in_RDI,in_RSI + 8);
      return in_RDI;
    }
  }
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string ObjectFile::getFilename() const
{
	if ((path.find_last_of(OS_PATHSEP) != std::string::npos) &&
	    (path.find_last_of(OS_PATHSEP) < path.size()))
	{
		return path.substr(path.find_last_of(OS_PATHSEP) + 1);
	}
	else
	{
		return path;
	}
}